

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

int __thiscall QFSFileEngine::open(QFSFileEngine *this,char *__file,int __oflag,...)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  undefined7 extraout_var;
  int iVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  ProcessOpenModeResult local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  bVar1 = QFileSystemEntry::isEmpty(&this_00->fileEntry);
  if (bVar1) {
    latin1.m_size = 0x16;
    latin1.m_data = "No file name specified";
    QString::QString((QString *)&local_58,latin1);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,OpenError,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    iVar2 = 0;
  }
  else {
    local_58.error.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.error.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.error.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    processOpenModeFlags
              (&local_58,(QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(__file,0));
    if (local_58.ok == false) {
      QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,OpenError,&local_58.error);
      iVar2 = 0;
    }
    else {
      (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (Int)local_58.openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      this_00->lastFlushFailed = false;
      this_00->field_0xc2 = this_00->field_0xc2 & 0xfb;
      this_00->fh = (FILE *)0x0;
      this_00->fd = -1;
      bVar1 = QFSFileEnginePrivate::nativeOpen(this_00,local_58.openMode,___oflag);
      iVar2 = (int)CONCAT71(extraout_var,bVar1);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58.error.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::open(QIODevice::OpenMode openMode,
                         std::optional<QFile::Permissions> permissions)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_D(QFSFileEngine);
    if (d->fileEntry.isEmpty()) {
        qWarning("QFSFileEngine::open: No file name specified");
        setError(QFile::OpenError, "No file name specified"_L1);
        return false;
    }

    const ProcessOpenModeResult res = processOpenModeFlags(openMode);
    if (!res.ok) {
        setError(QFileDevice::OpenError, res.error);
        return false;
    }

    d->openMode = res.openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;
    d->fh = nullptr;
    d->fd = -1;

    return d->nativeOpen(d->openMode, permissions);
}